

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O0

bool __thiscall Potassco::AspifTextInput::doAttach(AspifTextInput *this,bool *inc)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  byte *in_RSI;
  long in_RDI;
  char n;
  bool in_stack_0000003f;
  char *in_stack_00000040;
  AspifTextInput *in_stack_00000048;
  undefined1 in_stack_ffffffffffffffcf;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  byte bVar4;
  byte local_19;
  bool local_1;
  
  local_19 = ProgramReader::peek((ProgramReader *)
                                 CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                                 (bool)in_stack_ffffffffffffffcf);
  if ((*(long *)(in_RDI + 0x18) == 0) ||
     (((local_19 != 0 && (iVar2 = islower((uint)local_19), iVar2 == 0)) &&
      (pcVar3 = strchr(".#%{:",(int)(char)local_19), pcVar3 == (char *)0x0)))) {
    local_1 = false;
  }
  else {
    while (local_19 == 0x25) {
      ProgramReader::skipLine
                ((ProgramReader *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
      local_19 = ProgramReader::peek((ProgramReader *)
                                     CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                                     (bool)in_stack_ffffffffffffffcf);
    }
    bVar1 = match(in_stack_00000048,in_stack_00000040,in_stack_0000003f);
    bVar4 = false;
    if (bVar1) {
      match(in_stack_00000048,in_stack_00000040,in_stack_0000003f);
      bVar4 = ProgramReader::require
                        ((ProgramReader *)CONCAT17(bVar4,in_stack_ffffffffffffffd0),
                         (bool)in_stack_ffffffffffffffcf,(char *)0x10e343);
    }
    *in_RSI = bVar4;
    (**(code **)(**(long **)(in_RDI + 0x18) + 0x10))
              (*(long **)(in_RDI + 0x18),*in_RSI & 1,bVar4,
               CONCAT71((int7)((ulong)in_RSI >> 8),*in_RSI) & 0xffffffffffffff01);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool AspifTextInput::doAttach(bool& inc) {
	char n = peek(true);
	if (out_ && (!n || std::islower(static_cast<unsigned char>(n)) || std::strchr(".#%{:", n))) {
		while (n == '%') {
			skipLine();
			n = peek(true);
		}
		inc = match("#incremental", false) && require(match("."), "unrecognized directive");
		out_->initProgram(inc);
		return true;
	}
	return false;
}